

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O2

void ntru_decode(NTRUEncodeSchedule *sched,uint16_t *rs_out,ptrlen data)

{
  ulong uVar1;
  byte *pbVar2;
  ushort uVar3;
  size_t factor1;
  uint uVar4;
  size_t i;
  void *b;
  void *pvVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  size_t sVar9;
  uint uVar10;
  uint uVar11;
  void *pvVar12;
  
  pvVar5 = data.ptr;
  factor1 = sched->nvals;
  pvVar12 = (void *)(data.len + (long)pvVar5);
  b = safemalloc(factor1,4,0);
  uVar7 = sched->endpos;
  *(undefined4 *)((long)b + uVar7 * 4) = 0;
  sVar9 = sched->nops;
  uVar1 = factor1 - 1;
  uVar6 = uVar7;
  while (sVar9 = sVar9 - 1, sVar9 != 0xffffffffffffffff) {
    uVar3 = (ushort)sched->ops[sVar9];
    if (uVar3 == 1) {
      if (pvVar12 <= pvVar5) {
        __assert_fail("pos > base",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ntru.c"
                      ,0x33b,"void ntru_decode(NTRUEncodeSchedule *, uint16_t *, ptrlen)");
      }
      pbVar2 = (byte *)((long)pvVar12 - 1);
      pvVar12 = (void *)((long)pvVar12 - 1);
      *(uint *)((long)b + uVar7 * 4) = *(int *)((long)b + uVar7 * 4) << 8 | (uint)*pbVar2;
    }
    else {
      if (uVar3 == 0) {
        uVar6 = (uVar6 + uVar1) % factor1;
        *(undefined4 *)((long)b + uVar6 * 4) = *(undefined4 *)((long)b + uVar7 * 4);
      }
      else {
        uVar11 = *(uint *)((long)b + uVar7 * 4);
        uVar10 = uVar3 - 2 & 0xffff;
        uVar4 = (uint)(ushort)(SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1000000000000)) /
                                      ZEXT416(uVar10),0) * (ulong)uVar11 >> 0x30);
        uVar11 = uVar11 - uVar4 * uVar10;
        uVar8 = ((uint)uVar3 + ~uVar11) - 2 >> 0xf & 1;
        uVar6 = (uVar6 + uVar1) % factor1;
        *(uint *)((long)b + uVar6 * 4) = uVar8 + uVar4;
        uVar6 = (uVar6 + uVar1) % factor1;
        *(uint *)((long)b + uVar6 * 4) = uVar11 - uVar10 * uVar8 & 0xffff;
      }
      uVar7 = (uVar7 + uVar1) % factor1;
    }
  }
  if (pvVar12 != pvVar5) {
    __assert_fail("pos == base",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ntru.c",
                  0x35a,"void ntru_decode(NTRUEncodeSchedule *, uint16_t *, ptrlen)");
  }
  if (uVar6 == 0) {
    if (uVar7 == uVar1) {
      for (sVar9 = 0; factor1 != sVar9; sVar9 = sVar9 + 1) {
        rs_out[sVar9] = *(uint16_t *)((long)b + sVar9 * 4);
      }
      smemclr(b,factor1 << 2);
      safefree(b);
      return;
    }
    __assert_fail("tail == n-1",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ntru.c",
                  0x35c,"void ntru_decode(NTRUEncodeSchedule *, uint16_t *, ptrlen)");
  }
  __assert_fail("head == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ntru.c",
                0x35b,"void ntru_decode(NTRUEncodeSchedule *, uint16_t *, ptrlen)");
}

Assistant:

void ntru_decode(NTRUEncodeSchedule *sched, uint16_t *rs_out, ptrlen data)
{
    size_t n = sched->nvals;
    const uint8_t *base = (const uint8_t *)data.ptr;
    const uint8_t *pos = base + data.len;

    /*
     * Initialise the queue to a single zero, at the 'endpos' position
     * that will mean the final output is correctly aligned.
     *
     * 'head' and 'tail' have the same meanings as in encoding. So
     * 'tail' is the location that BYTE modifies and COPY and COMBINE
     * consume from, and 'head' is the location that COPY and COMBINE
     * push on to. As in encoding, they both point at the extremal
     * full slots in the array.
     */
    uint32_t *rs = snewn(n, uint32_t);
    size_t head = sched->endpos, tail = head;
    rs[tail] = 0;

    for (size_t i = sched->nops; i-- > 0 ;) {
        uint16_t op = sched->ops[i];
        switch (op) {
          case ENC_BYTE: {
            assert(pos > base);
            uint8_t byte = *--pos;
            rs[tail] = (rs[tail] << 8) | byte;
            break;
          }
          case ENC_COPY: {
            uint32_t r = rs[tail];
            tail = (tail + n - 1) % n;
            head = (head + n - 1) % n;
            rs[head] = r;
            break;
          }
          default: {
            uint32_t r = rs[tail];
            tail = (tail + n - 1) % n;

            uint32_t m = op - ENC_COMBINE_BASE;
            uint64_t mrecip = reciprocal_for_reduction(m);

            uint32_t r1, r2;
            r1 = reduce_with_quot(r, &r2, m, mrecip);

            head = (head + n - 1) % n;
            rs[head] = r2;
            head = (head + n - 1) % n;
            rs[head] = r1;
            break;
          }
        }
    }

    assert(pos == base);
    assert(head == 0);
    assert(tail == n-1);

    for (size_t i = 0; i < n; i++)
        rs_out[i] = rs[i];
    smemclr(rs, n * sizeof(*rs));
    sfree(rs);
}